

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# traversal_algorithm.cpp
# Opt level: O2

void __thiscall
libtorrent::dht::traversal_algorithm::add_entry
          (traversal_algorithm *this,node_id *id,endpoint *addr,observer_flags_t flags)

{
  byte bVar1;
  uint32_t uVar2;
  dht_observer *pdVar3;
  pointer psVar4;
  element_type *peVar5;
  const_iterator pvVar6;
  uint64_t uVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer psVar12;
  undefined4 extraout_var_01;
  undefined7 in_register_00000009;
  node_id *pnVar13;
  difference_type dVar14;
  char cVar15;
  address *addr_00;
  char cVar16;
  ulong uVar17;
  const_iterator __position;
  difference_type __d;
  ulong uVar18;
  bool bVar19;
  pair<std::_Rb_tree_iterator<unsigned_long>,_bool> pVar20;
  pair<std::_Rb_tree_iterator<unsigned_int>,_bool> pVar21;
  span<const_char> in;
  span<const_char> in_00;
  span<const_char> in_01;
  observer_ptr o;
  const_iterator prefix_it;
  const_iterator local_98;
  aux *local_90;
  uint64_t prefix6;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  aux *local_68;
  vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
  *local_60;
  address local_58;
  endpoint *ep;
  endpoint *ep_00;
  
  if (this->m_done != false) {
    return;
  }
  pnVar13 = id;
  (*this->_vptr_traversal_algorithm[5])(&o,this);
  if (o.super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    pdVar3 = this->m_node->m_observer;
    if (pdVar3 != (dht_observer *)0x0) {
      (*(pdVar3->super_dht_logger)._vptr_dht_logger[1])
                (pdVar3,4,"[%u] failed to allocate memory or observer. aborting!",(ulong)this->m_id)
      ;
    }
    (*this->_vptr_traversal_algorithm[4])(this);
  }
  else {
    ((o.super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->flags).
    m_val = ((o.super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            flags).m_val | flags.m_val;
    bVar8 = digest32<160L>::is_all_zeros(id);
    peVar5 = o.super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (bVar8) {
      generate_random_id();
      observer::set_id(peVar5,(node_id *)&prefix_it);
      ((o.super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->flags).
      m_val = ((o.super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->flags).m_val | 4;
      ::std::
      vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
      ::push_back(&this->m_results,&o);
      pdVar3 = this->m_node->m_observer;
      if ((pdVar3 != (dht_observer *)0x0) &&
         (iVar9 = (**(pdVar3->super_dht_logger)._vptr_dht_logger)(pdVar3,4), (char)iVar9 != '\0')) {
        uVar11 = this->m_id;
        in.m_len = (difference_type)pnVar13;
        in.m_ptr = (char *)0x14;
        aux::to_hex_abi_cxx11_((string *)&prefix_it,(aux *)id,in);
        pvVar6 = prefix_it;
        aux::print_endpoint_abi_cxx11_((string *)&prefix6,(aux *)addr,ep);
        uVar7 = prefix6;
        uVar10 = distance_exp(&this->m_target,id);
        cVar15 = this->m_invoke_count;
        iVar9 = (*this->_vptr_traversal_algorithm[2])(this);
        (*(pdVar3->super_dht_logger)._vptr_dht_logger[1])
                  (pdVar3,4,
                   "[%u] ADD (no-id) id: %s addr: %s distance: %d invoke-count: %d type: %s",
                   (ulong)uVar11,pvVar6,uVar7,(ulong)uVar10,(ulong)(uint)(int)cVar15,
                   CONCAT44(extraout_var,iVar9));
        ::std::__cxx11::string::~string((string *)&prefix6);
        ::std::__cxx11::string::~string((string *)&prefix_it);
      }
    }
    else {
      local_98 = (const_iterator)
                 CONCAT44(local_98._4_4_,(int)CONCAT71(in_register_00000009,flags.m_val));
      local_60 = &this->m_results;
      __position._M_current =
           (this->m_results).
           super__Vector_base<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      psVar12 = __position._M_current + this->m_sorted_results;
      uVar18 = (long)this->m_sorted_results;
      local_90 = (aux *)id;
      local_68 = (aux *)addr;
      while (uVar17 = uVar18, 0 < (long)uVar17) {
        uVar18 = uVar17 >> 1;
        bVar8 = compare_ref(&(__position._M_current[uVar18].
                              super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->m_id,
                            &(o.
                              super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->m_id,&this->m_target);
        if (bVar8) {
          __position._M_current = __position._M_current + uVar18 + 1;
          uVar18 = ~uVar18 + uVar17;
        }
      }
      if ((__position._M_current == psVar12) ||
         (bVar8 = digest32<160L>::operator!=
                            (&(((__position._M_current)->
                               super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr)->m_id,(digest32<160L> *)local_90), bVar8)) {
        bVar8 = aux::session_settings::get_bool(this->m_node->m_settings,0x8047);
        bVar19 = ((ulong)local_98 & 2) == 0;
        dVar14 = CONCAT71((int7)((ulong)pnVar13 >> 8),bVar19);
        if (bVar8 && bVar19) {
          observer::target_addr
                    (o.super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
          if ((int)prefix_it == 1) {
            observer::target_addr
                      (o.super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
            boost::asio::ip::address::to_v6((address_v6 *)&prefix6,(address *)&prefix_it);
            prefix_it = (const_iterator)&local_58;
            local_58.type_ = (anon_enum_32)prefix6;
            local_58.ipv4_address_.addr_.s_addr = (in4_addr_type)(in4_addr_type)prefix6._4_4_;
            local_58.ipv6_address_.addr_.__in6_u.__u6_addr32[0] = uStack_80;
            local_58.ipv6_address_.addr_.__in6_u.__u6_addr32[1] = uStack_7c;
            prefix6 = aux::read_impl<unsigned_long,unsigned_char_const*>();
            pVar20 = ::std::
                     _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                     ::_M_insert_unique<unsigned_long_const&>
                               ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                                 *)&this->m_peer6_prefixes,&prefix6);
            uVar18 = pVar20._8_8_;
          }
          else {
            observer::target_addr
                      (o.super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
            boost::asio::ip::address::to_v4(&local_58);
            prefix6 = CONCAT44(prefix6._4_4_,
                               (local_58.type_ & 0xff0000) >> 8 | (local_58.type_ & 0xff00) << 8 |
                               local_58.type_ << 0x18);
            pVar21 = ::std::
                     _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                     ::_M_insert_unique<unsigned_int_const&>
                               ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                                 *)&this->m_peer4_prefixes,(uint *)&prefix6);
            uVar18 = pVar21._8_8_;
          }
          if ((uVar18 & 1) == 0) {
            pdVar3 = this->m_node->m_observer;
            if ((pdVar3 != (dht_observer *)0x0) &&
               (iVar9 = (**(pdVar3->super_dht_logger)._vptr_dht_logger)(pdVar3,4),
               (char)iVar9 != '\0')) {
              uVar11 = this->m_id;
              in_01.m_len = dVar14;
              in_01.m_ptr = (char *)0x14;
              aux::to_hex_abi_cxx11_
                        ((string *)&prefix_it,
                         (aux *)&(o.
                                  super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->m_id,in_01);
              pvVar6 = prefix_it;
              observer::target_addr
                        (o.super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
              aux::print_address_abi_cxx11_((string *)&prefix6,(aux *)&local_58,addr_00);
              uVar7 = prefix6;
              iVar9 = (*this->_vptr_traversal_algorithm[2])(this);
              (*(pdVar3->super_dht_logger)._vptr_dht_logger[1])
                        (pdVar3,4,"[%u] traversal DUPLICATE node. id: %s addr: %s type: %s",
                         (ulong)uVar11,pvVar6,uVar7,CONCAT44(extraout_var_01,iVar9));
              ::std::__cxx11::string::~string((string *)&prefix6);
              ::std::__cxx11::string::~string((string *)&prefix_it);
            }
            goto LAB_0036fb1e;
          }
        }
        pdVar3 = this->m_node->m_observer;
        if ((pdVar3 != (dht_observer *)0x0) &&
           (iVar9 = (**(pdVar3->super_dht_logger)._vptr_dht_logger)(pdVar3,4), (char)iVar9 != '\0'))
        {
          uVar2 = this->m_id;
          in_00.m_len = dVar14;
          in_00.m_ptr = (char *)0x14;
          aux::to_hex_abi_cxx11_((string *)&prefix_it,local_90,in_00);
          local_98 = prefix_it;
          aux::print_endpoint_abi_cxx11_((string *)&prefix6,local_68,ep_00);
          uVar7 = prefix6;
          uVar11 = distance_exp(&this->m_target,(node_id *)local_90);
          cVar15 = this->m_invoke_count;
          iVar9 = (*this->_vptr_traversal_algorithm[2])(this);
          (*(pdVar3->super_dht_logger)._vptr_dht_logger[1])
                    (pdVar3,4,"[%u] ADD id: %s addr: %s distance: %d invoke-count: %d type: %s",
                     uVar2,local_98,uVar7,(ulong)uVar11,(ulong)(uint)(int)cVar15,
                     CONCAT44(extraout_var_00,iVar9));
          ::std::__cxx11::string::~string((string *)&prefix6);
          ::std::__cxx11::string::~string((string *)&prefix_it);
        }
        ::std::
        vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
        ::insert(local_60,__position,&o);
        this->m_sorted_results = this->m_sorted_results + '\x01';
      }
    }
    psVar12 = (this->m_results).
              super__Vector_base<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar4 = (this->m_results).
             super__Vector_base<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (0x640 < (ulong)((long)psVar4 - (long)psVar12)) {
      cVar15 = this->m_invoke_count;
      cVar16 = this->m_branch_factor;
      for (psVar12 = psVar12 + 100; psVar12 != psVar4; psVar12 = psVar12 + 1) {
        peVar5 = (psVar12->super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        bVar1 = (peVar5->flags).m_val;
        if ((bVar1 & 0x51) == 1) {
          (peVar5->flags).m_val = bVar1 | 0x80;
          cVar15 = cVar15 + -1;
          this->m_invoke_count = cVar15;
          if (((peVar5->flags).m_val & 8) != 0) {
            cVar16 = cVar16 + -1;
            this->m_branch_factor = cVar16;
          }
        }
      }
      ::std::
      vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
      ::resize(&this->m_results,100);
      cVar15 = 'd';
      if (this->m_sorted_results < 'd') {
        cVar15 = this->m_sorted_results;
      }
      this->m_sorted_results = cVar15;
    }
  }
LAB_0036fb1e:
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&o.super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void traversal_algorithm::add_entry(node_id const& id
	, udp::endpoint const& addr, observer_flags_t const flags)
{
	INVARIANT_CHECK;
	if (m_done) return;

	TORRENT_ASSERT(m_node.m_rpc.allocation_size() >= sizeof(find_data_observer));
	auto o = new_observer(addr, id);
	if (!o)
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (get_node().observer() != nullptr)
		{
			get_node().observer()->log(dht_logger::traversal, "[%u] failed to allocate memory or observer. aborting!"
				, m_id);
		}
#endif
		done();
		return;
	}

	o->flags |= flags;

	if (id.is_all_zeros())
	{
		o->set_id(generate_random_id());
		o->flags |= observer::flag_no_id;

		m_results.push_back(o);

#ifndef TORRENT_DISABLE_LOGGING
		dht_observer* logger = get_node().observer();
		if (logger != nullptr && logger->should_log(dht_logger::traversal))
		{
			logger->log(dht_logger::traversal
				, "[%u] ADD (no-id) id: %s addr: %s distance: %d invoke-count: %d type: %s"
				, m_id, aux::to_hex(id).c_str(), aux::print_endpoint(addr).c_str()
				, distance_exp(m_target, id), m_invoke_count, name());
		}
#endif
	}
	else
	{
		TORRENT_ASSERT(std::size_t(m_sorted_results) <= m_results.size());
		auto end = m_results.begin() + m_sorted_results;

		TORRENT_ASSERT(libtorrent::dht::is_sorted(m_results.begin(), end
				, [this](observer_ptr const& lhs, observer_ptr const& rhs)
				{ return compare_ref(lhs->id(), rhs->id(), m_target); }));

		auto iter = std::lower_bound(m_results.begin(), end, o
			, [this](observer_ptr const& lhs, observer_ptr const& rhs)
			{ return compare_ref(lhs->id(), rhs->id(), m_target); });

		if (iter == end || (*iter)->id() != id)
		{
			// this IP restriction does not apply to the nodes we loaded from out
			// node cache
			if (m_node.settings().get_bool(settings_pack::dht_restrict_search_ips)
				&& !(flags & observer::flag_initial))
			{
				if (o->target_addr().is_v6())
				{
					address_v6::bytes_type addr_bytes = o->target_addr().to_v6().to_bytes();
					auto prefix_it = addr_bytes.cbegin();
					std::uint64_t const prefix6 = aux::read_uint64(prefix_it);

					if (m_peer6_prefixes.insert(prefix6).second)
						goto add_result;
				}
				else
				{
					// mask the lower octet
					std::uint32_t const prefix4
						= o->target_addr().to_v4().to_uint() & 0xffffff00;

					if (m_peer4_prefixes.insert(prefix4).second)
						goto add_result;
				}

				// we already have a node in this search with an IP very
				// close to this one. We know that it's not the same, because
				// it claims a different node-ID. Ignore this to avoid attacks
#ifndef TORRENT_DISABLE_LOGGING
				dht_observer* logger = get_node().observer();
				if (logger != nullptr && logger->should_log(dht_logger::traversal))
				{
					logger->log(dht_logger::traversal
						, "[%u] traversal DUPLICATE node. id: %s addr: %s type: %s"
						, m_id, aux::to_hex(o->id()).c_str(), aux::print_address(o->target_addr()).c_str(), name());
				}
#endif
				return;
			}

	add_result:

			TORRENT_ASSERT((o->flags & observer::flag_no_id)
				|| std::none_of(m_results.begin(), end
					, [&id](observer_ptr const& ob) { return ob->id() == id; }));

#ifndef TORRENT_DISABLE_LOGGING
			dht_observer* logger = get_node().observer();
			if (logger != nullptr && logger->should_log(dht_logger::traversal))
			{
				logger->log(dht_logger::traversal
					, "[%u] ADD id: %s addr: %s distance: %d invoke-count: %d type: %s"
					, m_id, aux::to_hex(id).c_str(), aux::print_endpoint(addr).c_str()
					, distance_exp(m_target, id), m_invoke_count, name());
			}
#endif
			m_results.insert(iter, o);
			++m_sorted_results;
		}
	}

	TORRENT_ASSERT(std::size_t(m_sorted_results) <= m_results.size());
	TORRENT_ASSERT(libtorrent::dht::is_sorted(m_results.begin()
		, m_results.begin() + m_sorted_results
		, [this](observer_ptr const& lhs, observer_ptr const& rhs)
		{ return compare_ref(lhs->id(), rhs->id(), m_target); }));

	if (m_results.size() > 100)
	{
		std::for_each(m_results.begin() + 100, m_results.end()
			, [this](std::shared_ptr<observer> const& ptr)
		{
			if ((ptr->flags & (observer::flag_queried | observer::flag_failed | observer::flag_alive))
				== observer::flag_queried)
			{
				// set the done flag on any outstanding queries to prevent them from
				// calling finished() or failed()
				ptr->flags |= observer::flag_done;
				TORRENT_ASSERT(m_invoke_count > 0);
				--m_invoke_count;

				if (ptr->flags & observer::flag_short_timeout)
				{
					TORRENT_ASSERT(m_branch_factor > 0);
					--m_branch_factor;
				}
			}

#if TORRENT_USE_ASSERTS
			ptr->m_was_abandoned = true;
#endif
		});
		m_results.resize(100);
		m_sorted_results = std::min(std::int8_t(100), m_sorted_results);
	}
}